

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O1

SizeT Qentem::StringUtils::Hash<char>(char *key,SizeT length)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  if (length != 0) {
    uVar3 = (ulong)length;
    uVar2 = 0xb;
    iVar4 = 0;
    uVar5 = 0;
    iVar6 = 0x21;
    do {
      iVar8 = iVar4 + iVar6;
      uVar7 = (uint)uVar3;
      lVar1 = uVar3 - 1;
      uVar3 = uVar3 - 1;
      uVar2 = (int)key[lVar1] +
              (uVar7 ^ (uint)uVar5) * ((int)key[uVar5] * iVar6 * (uint)uVar5 + uVar2);
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + 2;
      iVar6 = iVar8;
    } while (uVar5 < uVar3);
    return uVar2 | 0x80000000;
  }
  return 0x8000000b;
}

Assistant:

static SizeT Hash(const Char_T *key, SizeT length) noexcept {
    constexpr SizeT highest_bit = (SizeT{1} << ((sizeof(SizeT) * 8) - SizeT{1}));

    SizeT hash   = SizeT{11};
    SizeT base   = SizeT{33};
    SizeT offset = 0;

    while (offset < length) {
        hash += (base * offset * SizeT(key[offset]));
        base += offset;

        if (offset != length) {
            hash *= (length ^ offset);
            base += offset;
            --length;
            hash += SizeT(key[length]);
        }

        ++offset;
    }

    return (hash | highest_bit);
}